

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void getEnvmap(char *attrName,int argc,char **argv,int *i,int part,SetAttrVector *attrs)

{
  int iVar1;
  invalid_argument *piVar2;
  ostream *poVar3;
  string *name;
  int *in_RCX;
  long in_RDX;
  int in_ESI;
  char *in_RDI;
  int in_R8D;
  SetAttr *in_R9;
  stringstream e;
  Envmap type;
  char *str;
  value_type *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  allocator<char> *in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  allocator<char> local_251;
  string local_250 [87];
  undefined1 local_1f9;
  string local_1f8 [32];
  stringstream local_1d8 [16];
  ostream local_1c8 [380];
  undefined4 local_4c;
  char *local_48;
  SetAttr *local_30;
  int local_24;
  int *local_20;
  char *local_8;
  
  if (in_ESI + -2 < *in_RCX) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"Expected an env map");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_48 = *(char **)(in_RDX + (long)(*in_RCX + 1) * 8);
  local_30 = in_R9;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_8 = in_RDI;
  iVar1 = strcmp(local_48,"latlong");
  if (iVar1 != 0) {
    iVar1 = strcmp(local_48,"LATLONG");
    if (iVar1 != 0) {
      iVar1 = strcmp(local_48,"cube");
      if (iVar1 != 0) {
        iVar1 = strcmp(local_48,"CUBE");
        if (iVar1 != 0) {
          std::__cxx11::stringstream::stringstream(local_1d8);
          poVar3 = std::operator<<(local_1c8,"The value for the ");
          poVar3 = std::operator<<(poVar3,local_8);
          std::operator<<(poVar3," attribute must be either LATLONG or CUBE");
          local_1f9 = 1;
          piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringstream::str();
          std::invalid_argument::invalid_argument(piVar2,local_1f8);
          local_1f9 = 0;
          __cxa_throw(piVar2,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      local_4c = 1;
      goto LAB_00106ff8;
    }
  }
  local_4c = 0;
LAB_00106ff8:
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  name = (string *)operator_new(0x10);
  Imf_3_4::TypedAttribute<Imf_3_4::Envmap>::TypedAttribute((Envmap *)name);
  SetAttr::SetAttr(local_30,name,local_24,(Attribute *)in_stack_fffffffffffffd58);
  std::vector<SetAttr,_std::allocator<SetAttr>_>::push_back
            ((vector<SetAttr,_std::allocator<SetAttr>_> *)
             CONCAT44(local_24,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58);
  SetAttr::~SetAttr((SetAttr *)0x10709c);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator(&local_251);
  *local_20 = *local_20 + 2;
  return;
}

Assistant:

void
getEnvmap (
    const char     attrName[],
    int            argc,
    char**         argv,
    int&           i,
    int            part,
    SetAttrVector& attrs)
{
    if (i > argc - 2) throw invalid_argument ("Expected an env map");

    char*  str = argv[i + 1];
    Envmap type;

    if (!strcmp (str, "latlong") || !strcmp (str, "LATLONG"))
    {
        type = ENVMAP_LATLONG;
    }
    else if (!strcmp (str, "cube") || !strcmp (str, "CUBE"))
    {
        type = ENVMAP_CUBE;
    }
    else
    {
        std::stringstream e;
        e << "The value for the " << attrName
          << " attribute must be either LATLONG or CUBE";
        throw invalid_argument (e.str ());
    }

    attrs.push_back (SetAttr (attrName, part, new EnvmapAttribute (type)));
    i += 2;
}